

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

GetSupportedFunctionResponseStruct * __thiscall
cfd::js::api::json::GetSupportedFunctionResponse::ConvertToStruct
          (GetSupportedFunctionResponseStruct *__return_storage_ptr__,
          GetSupportedFunctionResponse *this)

{
  GetSupportedFunctionResponse *this_local;
  GetSupportedFunctionResponseStruct *result;
  
  GetSupportedFunctionResponseStruct::GetSupportedFunctionResponseStruct(__return_storage_ptr__);
  __return_storage_ptr__->bitcoin = (bool)(this->bitcoin_ & 1);
  __return_storage_ptr__->elements = (bool)(this->elements_ & 1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

GetSupportedFunctionResponseStruct GetSupportedFunctionResponse::ConvertToStruct() const {  // NOLINT
  GetSupportedFunctionResponseStruct result;
  result.bitcoin = bitcoin_;
  result.elements = elements_;
  result.ignore_items = ignore_items;
  return result;
}